

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void Curl_hash_offt_init(Curl_hash *h,size_t slots,Curl_hash_dtor dtor)

{
  h->table = (Curl_llist *)0x0;
  h->hash_func = Curl_hash_str;
  h->comp_func = Curl_str_key_compare;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;
  return;
}

Assistant:

void Curl_hash_offt_init(struct Curl_hash *h,
                         size_t slots,
                         Curl_hash_dtor dtor)
{
  Curl_hash_init(h, slots, Curl_hash_str, Curl_str_key_compare, dtor);
}